

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

void __thiscall duckdb::FinalizeState::FinalizeState(FinalizeState *this,idx_t state_size_p)

{
  _Head_base<0UL,_unsigned_char_*,_false> __s;
  Allocator *allocator;
  ulong __n;
  LogicalType local_30;
  
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__FinalizeState_019b8db0;
  this->state_size = state_size_p;
  __n = state_size_p * 0x800 + 0x3800 & 0xffffffffffffc000;
  __s._M_head_impl = (uchar *)operator_new__(__n);
  switchD_00570541::default(__s._M_head_impl,0,__n);
  (this->state_buffer).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t
  .super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s._M_head_impl;
  LogicalType::LogicalType(&local_30,POINTER);
  Vector::Vector(&this->addresses,&local_30,0x800);
  LogicalType::~LogicalType(&local_30);
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&this->allocator,allocator,0x800);
  return;
}

Assistant:

explicit FinalizeState(idx_t state_size_p)
	    : state_size(state_size_p),
	      state_buffer(make_unsafe_uniq_array<data_t>(STANDARD_VECTOR_SIZE * AlignValue(state_size_p))),
	      addresses(LogicalType::POINTER), allocator(Allocator::DefaultAllocator()) {
	}